

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O2

void Rnm_ManPrintSelected(Rnm_Man_t *p,Vec_Int_t *vNewPPis)

{
  int *piVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int i;
  
  uVar6 = 0;
  for (i = 0; i < p->vMap->nSize; i = i + 1) {
    pGVar2 = p->pGia;
    iVar3 = Vec_IntEntry(p->vMap,i);
    pObj = Gia_ManObj(pGVar2,iVar3);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x9fffffff) == 0) {
      pGVar2 = p->pGia;
      iVar3 = Gia_ObjCioId(pObj);
      if (pGVar2->vCis->nSize - pGVar2->nRegs <= iVar3) goto LAB_00493ac4;
      iVar3 = 0x2d;
LAB_00493b01:
      putchar(iVar3);
    }
    else {
LAB_00493ac4:
      iVar3 = Gia_ObjId(p->pGia,pObj);
      uVar4 = (ulong)(uint)vNewPPis->nSize;
      if (vNewPPis->nSize < 1) {
        uVar4 = 0;
      }
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          iVar3 = 0x30;
          goto LAB_00493b01;
        }
        piVar1 = vNewPPis->pArray + uVar5;
        uVar5 = uVar5 + 1;
      } while (*piVar1 != iVar3);
      putchar(0x31);
      uVar6 = uVar6 + 1;
    }
  }
  printf(" %3d\n",(ulong)uVar6);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START 

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Rnm_ManPrintSelected( Rnm_Man_t * p, Vec_Int_t * vNewPPis )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        if ( Gia_ObjIsPi(p->pGia, pObj) ) 
            printf( "-" );
        else if ( Vec_IntFind(vNewPPis, Gia_ObjId(p->pGia, pObj)) >= 0 )// this is PPI
            printf( "1" ), Counter++;
        else
            printf( "0" );
    printf( " %3d\n", Counter );
}